

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O2

vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_> *
vk::getImageSparseMemoryRequirements
          (vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
           *__return_storage_ptr__,DeviceInterface *vk,VkDevice device,VkImage image)

{
  uint in_EAX;
  long lVar1;
  TestError *this;
  ulong uStack_28;
  deUint32 requirementsCount;
  
  uStack_28 = (ulong)in_EAX;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*vk->_vptr_DeviceInterface[0x10])(vk,device,image.m_internal,&requirementsCount,0);
  if (uStack_28 >> 0x20 != 0) {
    std::
    vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
    ::resize(__return_storage_ptr__,uStack_28 >> 0x20);
    (*vk->_vptr_DeviceInterface[0x10])
              (vk,device,image.m_internal,&requirementsCount,
               (__return_storage_ptr__->
               super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
               )._M_impl.super__Vector_impl_data._M_start);
    lVar1 = (long)(__return_storage_ptr__->
                  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(__return_storage_ptr__->
                  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    if (lVar1 / 0x30 != uStack_28 >> 0x20) {
      this = (TestError *)__cxa_allocate_exception(0x38,0x30,lVar1 % 0x30);
      tcu::TestError::TestError
                (this,"Returned sparse image memory requirements count changes between queries",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                 ,0x98);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkSparseImageMemoryRequirements> getImageSparseMemoryRequirements(const DeviceInterface& vk, VkDevice device, VkImage image)
{
	deUint32								requirementsCount = 0;
	vector<VkSparseImageMemoryRequirements> requirements;

	vk.getImageSparseMemoryRequirements(device, image, &requirementsCount, DE_NULL);

	if (requirementsCount > 0)
	{
		requirements.resize(requirementsCount);
		vk.getImageSparseMemoryRequirements(device, image, &requirementsCount, &requirements[0]);

		if ((size_t)requirementsCount != requirements.size())
			TCU_FAIL("Returned sparse image memory requirements count changes between queries");
	}

	return requirements;
}